

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

int get_curr_stat(CHAR_DATA *ch,int stat)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  CClass *pCVar4;
  int *piVar5;
  int in_ESI;
  CHAR_DATA *in_RDI;
  int iClass;
  int mod;
  int max;
  AFFECT_DATA *af;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_28;
  int local_24;
  undefined4 local_20;
  int local_1c;
  AFFECT_DATA *local_18;
  int local_c;
  CHAR_DATA *local_8;
  
  local_20 = 0;
  local_c = in_ESI;
  local_8 = in_RDI;
  bVar1 = is_npc(in_stack_ffffffffffffffb8);
  if ((bVar1) || (0x34 < local_8->level)) {
    local_1c = 0x19;
    goto LAB_005f6752;
  }
  local_1c = (int)*(short *)((long)local_8->race * 0x88 + 0x921170 + (long)local_c * 2);
  pvVar3 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                     (&race_table,(long)local_8->race);
  bVar1 = str_cmp(pvVar3->name,"human");
  if (!bVar1) {
    pCVar4 = char_data::Class((char_data *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_24 = CClass::GetIndex(pCVar4);
    pCVar4 = char_data::Class((char_data *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    switch(pCVar4->attr_prime) {
    case 0:
      if (local_c == 0) {
        pCVar4 = char_data::Class((char_data *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        iVar2 = CClass::GetIndex(pCVar4);
        if (iVar2 != 1) {
          pCVar4 = char_data::Class((char_data *)
                                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          iVar2 = CClass::GetIndex(pCVar4);
          if (iVar2 != 5) {
            pCVar4 = char_data::Class((char_data *)
                                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
            ;
            iVar2 = CClass::GetIndex(pCVar4);
            if (iVar2 != 6) {
              pCVar4 = char_data::Class((char_data *)
                                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0
                                                ));
              iVar2 = CClass::GetIndex(pCVar4);
              if (iVar2 != 4) goto LAB_005f6631;
            }
          }
        }
        local_1c = 0x17;
      }
      else {
LAB_005f6631:
        local_1c = 0x14;
      }
      break;
    case 1:
      if (local_c == 1) {
        pCVar4 = char_data::Class((char_data *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        iVar2 = CClass::GetIndex(pCVar4);
        if (iVar2 != 0xb) {
          pCVar4 = char_data::Class((char_data *)
                                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          iVar2 = CClass::GetIndex(pCVar4);
          if (iVar2 != 10) {
            pCVar4 = char_data::Class((char_data *)
                                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
            ;
            iVar2 = CClass::GetIndex(pCVar4);
            if (iVar2 != 8) goto LAB_005f6694;
          }
        }
        local_1c = 0x17;
      }
      else {
LAB_005f6694:
        local_1c = 0x14;
      }
      break;
    case 2:
      if (local_c == 2) {
        pCVar4 = char_data::Class((char_data *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        iVar2 = CClass::GetIndex(pCVar4);
        if (iVar2 != 9) {
          pCVar4 = char_data::Class((char_data *)
                                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          iVar2 = CClass::GetIndex(pCVar4);
          if (iVar2 != 3) goto LAB_005f66e0;
        }
        local_1c = 0x17;
      }
      else {
LAB_005f66e0:
        local_1c = 0x14;
      }
      break;
    case 3:
      if (local_c == 3) {
        pCVar4 = char_data::Class((char_data *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        iVar2 = CClass::GetIndex(pCVar4);
        if (iVar2 != 7) {
          pCVar4 = char_data::Class((char_data *)
                                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          iVar2 = CClass::GetIndex(pCVar4);
          if (iVar2 != 2) goto LAB_005f6729;
        }
        local_1c = 0x17;
      }
      else {
LAB_005f6729:
        local_1c = 0x14;
      }
    }
  }
  local_28 = 0x19;
  piVar5 = std::min<int>(&local_1c,&local_28);
  local_1c = *piVar5;
LAB_005f6752:
  if (((local_8->fighting != (CHAR_DATA *)0x0) &&
      (bVar1 = is_affected(local_8->fighting,(int)gsn_traitors_luck), bVar1)) &&
     (local_18 = affect_find(local_8->fighting->affected,(int)gsn_traitors_luck),
     local_8 == local_18->owner)) {
    local_20 = 2;
  }
  piVar5 = std::min<int>((int *)&stack0xffffffffffffffd4,(int *)&stack0xffffffffffffffd0);
  return *piVar5;
}

Assistant:

int get_curr_stat(CHAR_DATA *ch, int stat)
{
	AFFECT_DATA *af;
	int max;
	int mod = 0;

	if (is_npc(ch) || ch->level > LEVEL_IMMORTAL)
		max = 25;

	else
	{
		max = pc_race_table[ch->race].max_stats[stat];

		if (!str_cmp(race_table[ch->race].name, "human"))
		{
			int iClass;
			iClass = ch->Class()->GetIndex();
			switch (ch->Class()->attr_prime)
			{
				case STAT_STR:
					if (stat == STAT_STR &&
						(ch->Class()->GetIndex() == CLASS_WARRIOR || ch->Class()->GetIndex() == CLASS_ANTI_PALADIN ||
						ch->Class()->GetIndex() == CLASS_RANGER || ch->Class()->GetIndex() == CLASS_PALADIN))
						max = 23;
					else
						max = 20;
					break;
				case STAT_INT:
					if (stat == STAT_INT &&
						(ch->Class()->GetIndex() == CLASS_SORCERER || ch->Class()->GetIndex() == CLASS_NECROMANCER ||
						ch->Class()->GetIndex() == CLASS_SHAPESHIFTER))
						max = 23;
					else
						max = 20;
					break;
				case STAT_WIS:
					if (stat == STAT_WIS &&
						(ch->Class()->GetIndex() == CLASS_HEALER || ch->Class()->GetIndex() == CLASS_ZEALOT))
						max = 23;
					else
						max = 20;
					break;
				case STAT_DEX:
					if (stat == STAT_DEX &&
						(ch->Class()->GetIndex() == CLASS_ASSASSIN || ch->Class()->GetIndex() == CLASS_THIEF))
						max = 23;
					else
						max = 20;
					break;
			}
		}

		max = std::min(max, 25);
	}

	if (ch->fighting && is_affected(ch->fighting, gsn_traitors_luck))
	{
		af = affect_find(ch->fighting->affected, gsn_traitors_luck);

		if (ch == af->owner)
			mod = 2;
	}

	return std::min(URANGE(3, ch->perm_stat[stat] + ch->mod_stat[stat], max) + mod, 25);
}